

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

void __thiscall llvm::detail::IEEEFloat::copySignificand(IEEEFloat *this,IEEEFloat *rhs)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  integerPart *dst;
  integerPart *src;
  bool bVar4;
  IEEEFloat *rhs_local;
  IEEEFloat *this_local;
  
  bVar1 = isFiniteNonZero(this);
  bVar4 = true;
  if (!bVar1) {
    bVar4 = (this->field_0x12 & 7) == 1;
  }
  if (!bVar4) {
    __assert_fail("isFiniteNonZero() || category == fcNaN",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0x2a8,"void llvm::detail::IEEEFloat::copySignificand(const IEEEFloat &)");
  }
  uVar2 = partCount(rhs);
  uVar3 = partCount(this);
  if (uVar3 <= uVar2) {
    dst = significandParts(this);
    src = significandParts(rhs);
    uVar2 = partCount(this);
    APInt::tcAssign(dst,src,uVar2);
    return;
  }
  __assert_fail("rhs.partCount() >= partCount()",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                ,0x2a9,"void llvm::detail::IEEEFloat::copySignificand(const IEEEFloat &)");
}

Assistant:

void IEEEFloat::copySignificand(const IEEEFloat &rhs) {
  assert(isFiniteNonZero() || category == fcNaN);
  assert(rhs.partCount() >= partCount());

  APInt::tcAssign(significandParts(), rhs.significandParts(),
                  partCount());
}